

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O2

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteDenseArrayIndexProperties
          (SerializationCloner<Js::StreamWriter> *this,JavascriptArray *arr)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = JavascriptArray::IsNonES5Array(arr);
  if (!bVar1) {
    WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayEnumerableItemAccessor>
              (this,arr);
    return;
  }
  iVar2 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])
                    (arr);
  if (iVar2 != 0) {
    WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
              (this,arr);
    return;
  }
  WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayDirectItemAccessor>
            (this,arr);
  return;
}

Assistant:

void SerializationCloner<Writer>::WriteDenseArrayIndexProperties(JavascriptArray* arr)
    {
        if (JavascriptArray::IsNonES5Array(arr))
        {
            if (!arr->IsCrossSiteObject())
            {
                WriteArrayIndexProperties<JavascriptArrayDirectItemAccessor>(arr);
            }
            else
            {
                WriteArrayIndexProperties<JavascriptArrayItemAccessor>(arr);
            }
        }
        else
        {
            WriteArrayIndexProperties<JavascriptArrayEnumerableItemAccessor>(arr);
        }
    }